

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O2

void ansv<unsigned_long,2,2,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  unsigned_long uVar4;
  ulong uVar5;
  pointer puVar6;
  uint __line;
  unsigned_long *puVar7;
  _Map_pointer pppVar8;
  unsigned_long uVar9;
  size_type sVar10;
  size_type sVar11;
  long lVar12;
  _Elt_pointer ppVar13;
  _Elt_pointer ppVar14;
  pointer ppVar15;
  _Elt_pointer ppVar16;
  ulong uVar17;
  _Map_pointer pppVar18;
  ulong uVar19;
  char *__assertion;
  pointer ppVar20;
  ulong uVar21;
  size_t i;
  long lVar22;
  ulong uVar23;
  _Elt_pointer ppVar24;
  size_t i_1;
  _Elt_pointer ppVar25;
  ulong uVar26;
  reverse_iterator it2;
  size_t local_size;
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  q;
  unsigned_long local_min;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_190;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  _Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>
  local_b8;
  _Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>
  local_98;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_Deque_base(&q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               );
  local_size = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start >> 3;
  uVar9 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_size,comm);
  lVar12 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
LAB_00140af7:
  lVar22 = lVar12 + -1;
  if (lVar12 != 0) {
    while (q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ppVar25 = q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar25 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      if (ppVar25[-1].first <=
          (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar22]) break;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(&q);
    }
    do {
      sVar10 = std::
               deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::size(&q);
      if (sVar10 < 2) goto LAB_00140be8;
      ppVar25 = q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar25 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      uVar4 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar22];
      if (uVar4 != ppVar25[-1].first) goto LAB_00140be8;
      local_190.current._M_cur =
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_190.current._M_first =
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_190.current._M_last =
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_last;
      local_190.current._M_node =
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node;
      std::
      reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
      ::operator+((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                   *)&it2,&local_190,1);
      ppVar25 = it2.current._M_cur;
      if (it2.current._M_cur == it2.current._M_first) {
        ppVar25 = it2.current._M_node[-1] + 0x20;
      }
      if (uVar4 != ppVar25[-1].first) goto LAB_00140be8;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(&q);
    } while( true );
  }
  local_58.current._M_cur =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&it2,&local_58,&local_78,(allocator_type *)&local_190);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_move_assign(lr_mins,&it2);
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)&it2);
  sVar10 = std::
           deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::size(&q);
  if (sVar10 == 0) {
    __assertion = "n_left_mins >= 1";
    __line = 0x60;
  }
  else {
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::clear(&q);
    uVar23 = 0;
LAB_00140cb4:
    if (uVar23 < (ulong)((long)(in->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(in->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3)) {
      while (q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar25 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar25 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar25[-1].first <=
            (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar23]) break;
        std::
        deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::pop_back(&q);
      }
      do {
        sVar11 = std::
                 deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::size(&q);
        if (sVar11 < 2) goto LAB_00140db9;
        ppVar25 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar25 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        uVar4 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar23];
        if (uVar4 != ppVar25[-1].first) goto LAB_00140db9;
        local_190.current._M_cur =
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_190.current._M_first =
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
        local_190.current._M_last =
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last;
        local_190.current._M_node =
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
        std::
        reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
        ::operator+((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                     *)&it2,&local_190,1);
        ppVar25 = it2.current._M_cur;
        if (it2.current._M_cur == it2.current._M_first) {
          ppVar25 = it2.current._M_node[-1] + 0x20;
        }
        if (uVar4 != ppVar25[-1].first) goto LAB_00140db9;
        std::
        deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::pop_back(&q);
      } while( true );
    }
    sVar11 = std::
             deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::size(&q);
    local_98._M_cur =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_98._M_first =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_98._M_last =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_98._M_node =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_b8._M_cur =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_b8._M_first =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_b8._M_last =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_b8._M_node =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::
    insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>,void>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)lr_mins,
               (lr_mins->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,&local_98,&local_b8);
    local_min = (q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
    if (sVar11 != 0) {
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::clear(&q);
      if (sVar11 + sVar10 !=
          (long)(lr_mins->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(lr_mins->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4) {
        __assertion = "n_right_mins + n_left_mins == lr_mins.size()";
        __line = 0x78;
        goto LAB_00141915;
      }
      mxx::allgather<unsigned_long>(&allmins,&local_min,comm);
      it2.current._M_cur = (_Elt_pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&send_counts,(long)comm->m_size,(value_type_conflict *)&it2,
                 (allocator_type *)&local_190);
      it2.current._M_cur = (_Elt_pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&send_displs,(long)comm->m_size,(value_type_conflict *)&it2,
                 (allocator_type *)&local_190);
      iVar2 = comm->m_rank;
      lVar12 = (long)iVar2;
      if (0 < lVar12) {
        ppVar15 = (lr_mins->
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar19 = 0;
        lVar22 = lVar12;
        uVar23 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12 + -1];
        do {
          do {
            if (lVar22 < 1) goto LAB_00140fa2;
            uVar26 = uVar19;
            if (((uVar19 != 0) && (lVar22 < lVar12)) &&
               (uVar26 = uVar19 - 1, uVar23 < ppVar15[uVar19 - 1].first)) {
              uVar26 = uVar19;
            }
            lVar22 = lVar22 + -1;
            uVar21 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar22];
            uVar5 = uVar19;
            ppVar20 = (lr_mins->
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar19;
            do {
              uVar19 = uVar5;
              if (sVar10 <= uVar19 + 1) break;
              puVar7 = &ppVar20->first;
              uVar5 = uVar19 + 1;
              ppVar20 = ppVar20 + 1;
            } while (uVar21 <= *puVar7);
          } while (uVar23 < uVar21);
          send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar22] = (uVar19 - uVar26) + 1;
          send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar22] = uVar26;
          uVar23 = uVar21;
        } while (local_min <=
                 allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22]);
      }
LAB_00140fa2:
      iVar3 = comm->m_size;
      if (iVar2 < iVar3 + -1) {
        ppVar15 = (lr_mins->
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar19 = (long)(lr_mins->
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar15 >> 4;
        sVar11 = uVar19 - 1;
        lVar22 = lVar12;
        uVar23 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12 + 1];
        do {
          do {
            lVar1 = lVar22 + 1;
            if (iVar3 <= lVar1) goto LAB_00141093;
            uVar26 = sVar11;
            if (lVar12 < lVar22) {
              ppVar20 = ppVar15 + sVar11 + 1;
              uVar21 = sVar11;
              do {
                uVar26 = uVar21;
                if (uVar19 <= uVar26 + 1) break;
                puVar7 = &ppVar20->first;
                ppVar20 = ppVar20 + 1;
                uVar21 = uVar26 + 1;
              } while (*puVar7 <= uVar23);
            }
            uVar21 = sVar11;
            if (sVar10 < sVar11) {
              uVar21 = sVar10;
            }
            uVar5 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar1];
            for (ppVar20 = ppVar15 + sVar11;
                (uVar17 = uVar21, sVar10 < sVar11 && (uVar17 = sVar11, uVar5 <= ppVar20->first));
                ppVar20 = ppVar20 + -1) {
              sVar11 = sVar11 - 1;
            }
            sVar11 = uVar17;
            lVar22 = lVar1;
          } while (uVar23 < uVar5);
          send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar1] = (uVar26 - uVar17) + 1;
          send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar1] = uVar17;
          uVar23 = uVar5;
        } while (local_min <=
                 allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1]);
      }
LAB_00141093:
      mxx::all2all<unsigned_long>(&recv_counts,&send_counts,comm);
      mxx::impl::get_displacements<unsigned_long>(&recv_displs,&recv_counts);
      uVar9 = recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      uVar4 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::vector(&recved,uVar9 + uVar4,(allocator_type *)&it2);
      mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
                ((lr_mins->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,&send_counts,&send_displs,
                 recved.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,&recv_counts,&recv_displs,comm);
      uVar19 = recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_start[comm->m_rank];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(right_nsv,local_size);
      uVar23 = (uVar9 + uVar4) - uVar19;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::clear(&q);
      lVar12 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
      ppVar25 = (_Elt_pointer)(lVar12 >> 3);
      while( true ) {
        ppVar25 = (_Elt_pointer)((long)&ppVar25[-1].second + 7);
        lVar12 = lVar12 + -8;
        if (ppVar25 == (_Elt_pointer)0xffffffffffffffff) break;
        update_nsv_queue<unsigned_long,2>
                  (left_nsv,&q,
                   (unsigned_long *)
                   ((long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar12),(size_t)ppVar25,0);
        it2.current._M_cur =
             (_Elt_pointer)
             (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[(long)ppVar25];
        it2.current._M_first = ppVar25;
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
      }
      uVar26 = 0;
      do {
        if ((uVar19 <= uVar26) ||
           (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
          ppVar25 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last;
          pppVar18 = q.
                     super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar24 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first;
          ppVar13 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          do {
            ppVar16 = ppVar13;
            ppVar14 = ppVar24;
            pppVar8 = pppVar18;
            if (ppVar13 ==
                q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              std::
              deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::clear(&q);
              for (ppVar25 = (_Elt_pointer)0x0;
                  puVar6 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                  ppVar25 < (_Elt_pointer)
                            ((long)(in->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3);
                  ppVar25 = (_Elt_pointer)((long)&ppVar25->first + 1)) {
                update_nsv_queue<unsigned_long,2>
                          (right_nsv,&q,puVar6 + (long)ppVar25,(size_t)ppVar25,0);
                it2.current._M_cur =
                     (_Elt_pointer)
                     (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start[(long)ppVar25];
                it2.current._M_first = ppVar25;
                std::
                deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                          ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                            *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
              }
              uVar26 = 0;
              do {
                if ((uVar23 <= uVar26) ||
                   (q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
                  ppVar25 = q.
                            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first;
                  ppVar24 = q.
                            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  pppVar18 = q.
                             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node;
                  do {
                    ppVar13 = ppVar24;
                    ppVar16 = ppVar25;
                    ppVar14 = q.
                              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_last;
                    pppVar8 = pppVar18;
                    if (ppVar24 ==
                        q.
                        super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                      std::
                      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::operator=(lr_mins,&recved);
                      std::
                      _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::~_Vector_base(&recved.
                                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     );
                      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                      ~_Vector_base(&recv_displs.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   );
                      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                      ~_Vector_base(&recv_counts.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   );
                      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                      ~_Vector_base(&send_displs.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   );
                      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                      ~_Vector_base(&send_counts.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   );
                      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                      ~_Vector_base(&allmins.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   );
                      std::
                      _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::~_Deque_base(&q.
                                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    );
                      return;
                    }
                    while (it2.current._M_node = pppVar8, it2.current._M_last = ppVar14,
                          it2.current._M_first = ppVar16, it2.current._M_cur = ppVar13,
                          std::
                          reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                          ::operator+(&local_190,&it2,1),
                          local_190.current._M_cur !=
                          q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                      ppVar13 = ppVar24;
                      if (ppVar24 == ppVar25) {
                        ppVar13 = pppVar18[-1] + 0x20;
                      }
                      uVar9 = ppVar13[-1].first;
                      std::
                      reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                      ::operator+(&local_138,&it2,1);
                      ppVar13 = local_138.current._M_cur;
                      if (local_138.current._M_cur == local_138.current._M_first) {
                        ppVar13 = local_138.current._M_node[-1] + 0x20;
                      }
                      if (uVar9 != ppVar13[-1].first) break;
                      if (it2.current._M_cur == it2.current._M_first) {
                        it2.current._M_first = it2.current._M_node[-1];
                        it2.current._M_cur = it2.current._M_first + 0x20;
                        it2.current._M_last = it2.current._M_cur;
                        it2.current._M_node = it2.current._M_node + -1;
                      }
                      ppVar13 = it2.current._M_cur + -1;
                      ppVar16 = ppVar24;
                      if (ppVar24 == ppVar25) {
                        ppVar16 = pppVar18[-1] + 0x20;
                      }
                      ppVar14 = ppVar13;
                      if (ppVar13 == it2.current._M_first) {
                        ppVar14 = it2.current._M_node[-1] + 0x20;
                      }
                      (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                      ._M_impl.super__Vector_impl_data._M_start[ppVar14[-1].second] =
                           ppVar16[-1].second;
                      ppVar16 = it2.current._M_first;
                      ppVar14 = it2.current._M_last;
                      pppVar8 = it2.current._M_node;
                    }
                    if (ppVar24 == ppVar25) {
                      ppVar24 = pppVar18[-1] + 0x20;
                    }
                    (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[ppVar24[-1].second] = nonsv;
                    q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last = it2.current._M_last;
                    ppVar25 = it2.current._M_first;
                    ppVar24 = it2.current._M_cur;
                    pppVar18 = it2.current._M_node;
                    if (it2.current._M_cur == it2.current._M_first) {
                      q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last =
                           it2.current._M_node[-1] + 0x20;
                      ppVar25 = it2.current._M_node[-1];
                      ppVar24 = q.
                                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_last;
                      pppVar18 = it2.current._M_node + -1;
                    }
                    ppVar24 = ppVar24 + -1;
                  } while( true );
                }
                lVar12 = uVar26 + uVar19;
                update_nsv_queue<unsigned_long,2>
                          (right_nsv,&q,
                           &recved.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar12].first,
                           lVar12 + local_size,0);
                if (q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                    q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                  ppVar25 = q.
                            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    ppVar25 = q.
                              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                  }
                  lVar22 = lVar12 * 0x10;
                  uVar21 = uVar26;
                  if (recved.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar12].first == ppVar25[-1].first)
                  {
                    do {
                      uVar26 = uVar21;
                      lVar12 = lVar22;
                      if (uVar23 <= uVar26 + 1) break;
                      lVar22 = lVar12 + 0x10;
                      uVar21 = uVar26 + 1;
                    } while (*(long *)((long)&(recved.
                                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first +
                                      lVar12) ==
                             *(long *)((long)&recved.
                                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[1].first +
                                      lVar12));
                    while (q.
                           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                           q.
                           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                      ppVar25 = q.
                                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                      if (q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                        ppVar25 = q.
                                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                      }
                      if (ppVar25[-1].first !=
                          *(unsigned_long *)
                           ((long)&(recved.
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->first + lVar12))
                      break;
                      ppVar25 = q.
                                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                      if (q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                        ppVar25 = q.
                                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                      }
                      (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                      ._M_impl.super__Vector_impl_data._M_start[ppVar25[-1].second] =
                           local_size + uVar19 + uVar26;
                      std::
                      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::pop_back(&q);
                    }
                  }
                }
                uVar26 = uVar26 + 1;
              } while( true );
            }
            while (it2.current._M_node = pppVar8, it2.current._M_last = ppVar25,
                  it2.current._M_first = ppVar14, it2.current._M_cur = ppVar16,
                  std::
                  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                  ::operator+(&local_190,&it2,1),
                  local_190.current._M_cur !=
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              ppVar25 = ppVar13;
              if (ppVar13 == ppVar24) {
                ppVar25 = pppVar18[-1] + 0x20;
              }
              uVar9 = ppVar25[-1].first;
              std::
              reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
              ::operator+(&local_138,&it2,1);
              ppVar25 = local_138.current._M_cur;
              if (local_138.current._M_cur == local_138.current._M_first) {
                ppVar25 = local_138.current._M_node[-1] + 0x20;
              }
              if (uVar9 != ppVar25[-1].first) break;
              if (it2.current._M_cur == it2.current._M_first) {
                it2.current._M_first = it2.current._M_node[-1];
                it2.current._M_cur = it2.current._M_first + 0x20;
                it2.current._M_last = it2.current._M_cur;
                it2.current._M_node = it2.current._M_node + -1;
              }
              ppVar16 = it2.current._M_cur + -1;
              ppVar25 = ppVar13;
              if (ppVar13 == ppVar24) {
                ppVar25 = pppVar18[-1] + 0x20;
              }
              ppVar14 = ppVar16;
              if (ppVar16 == it2.current._M_first) {
                ppVar14 = it2.current._M_node[-1] + 0x20;
              }
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[ppVar14[-1].second] = ppVar25[-1].second;
              ppVar14 = it2.current._M_first;
              ppVar25 = it2.current._M_last;
              pppVar8 = it2.current._M_node;
            }
            if (ppVar13 == ppVar24) {
              ppVar13 = pppVar18[-1] + 0x20;
            }
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar13[-1].second] = nonsv;
            ppVar25 = it2.current._M_last;
            pppVar18 = it2.current._M_node;
            ppVar24 = it2.current._M_first;
            ppVar13 = it2.current._M_cur;
            if (it2.current._M_cur == it2.current._M_first) {
              ppVar25 = it2.current._M_node[-1] + 0x20;
              pppVar18 = it2.current._M_node + -1;
              ppVar24 = it2.current._M_node[-1];
              ppVar13 = ppVar25;
            }
            ppVar13 = ppVar13 + -1;
          } while( true );
        }
        lVar12 = ~uVar26 + uVar19;
        lVar22 = lVar12 * 0x10;
        update_nsv_queue<unsigned_long,2>
                  (left_nsv,&q,
                   &recved.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar12].first,lVar12 + local_size,0);
        uVar21 = uVar26;
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          ppVar25 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar25 = q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (recved.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar12].first == ppVar25[-1].first) {
            for (ppVar15 = recved.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar19 + (-1 - uVar26);
                (lVar12 = (uVar19 - 1) - uVar26, uVar21 = uVar19 - 1, lVar12 != 0 &&
                (uVar21 = uVar26, ppVar15->first == ppVar15[-1].first)); ppVar15 = ppVar15 + -1) {
              uVar26 = uVar26 + 1;
              lVar22 = lVar22 + -0x10;
            }
            while (q.
                   super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                   q.
                   super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              ppVar25 = q.
                        super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar25 = q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              if (ppVar25[-1].first !=
                  *(unsigned_long *)
                   ((long)&(recved.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first + lVar22)) break;
              ppVar25 = q.
                        super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar25 = q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[ppVar25[-1].second] = local_size + lVar12;
              std::
              deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::pop_back(&q);
            }
          }
        }
        uVar26 = uVar21 + 1;
      } while( true );
    }
    __assertion = "n_right_mins >= 1";
    __line = 0x76;
  }
LAB_00141915:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                ,__line,
                "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 1]"
               );
LAB_00140be8:
  it2.current._M_first = (_Elt_pointer)(lVar12 + (uVar9 - 1));
  it2.current._M_cur =
       (_Elt_pointer)
       (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start[lVar22];
  std::
  deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::emplace_back<std::pair<unsigned_long,unsigned_long>>
            ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
  lVar12 = lVar22;
  goto LAB_00140af7;
LAB_00140db9:
  it2.current._M_first = (_Elt_pointer)(uVar9 + uVar23);
  it2.current._M_cur =
       (_Elt_pointer)
       (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start[uVar23];
  std::
  deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::emplace_back<std::pair<unsigned_long,unsigned_long>>
            ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
  uVar23 = uVar23 + 1;
  goto LAB_00140cb4;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}